

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_conn.c
# Opt level: O1

csp_conn_t * csp_conn_new(csp_id_t_conflict idin,csp_id_t_conflict idout,csp_conn_type_t type)

{
  uint32_t uVar1;
  csp_conn_t *conn;
  csp_id_t_conflict local_18;
  csp_id_t_conflict local_10;
  
  local_18 = idout;
  local_10 = idin;
  conn = csp_conn_allocate(type);
  if (conn != (csp_conn_t *)0x0) {
    csp_id_copy(&conn->idin,&local_10);
    csp_id_copy(&conn->idout,&local_18);
    uVar1 = csp_get_ms();
    conn->timestamp = uVar1;
    csp_conn_flush_rx_queue(conn);
  }
  return conn;
}

Assistant:

csp_conn_t * csp_conn_new(csp_id_t idin, csp_id_t idout, csp_conn_type_t type) {

	/* Allocate connection structure */
	csp_conn_t * conn = csp_conn_allocate(type);

	if (conn) {
		/* No lock is needed here, because nobody else *
		 * has a reference to this connection yet.     */
		csp_id_copy(&conn->idin, &idin);
		csp_id_copy(&conn->idout, &idout);

		conn->timestamp = csp_get_ms();

		/* Ensure connection queue is empty */
		csp_conn_flush_rx_queue(conn);
	}

	return conn;
}